

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::changeEvent(QWidget *this,QEvent *event)

{
  ushort uVar1;
  QWidgetData *pQVar2;
  QWidgetPrivate *this_00;
  QLayout *pQVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char cVar7;
  QStyle *pQVar8;
  QWidgetPrivate *d;
  long in_FS_OFFSET;
  code *local_48;
  undefined1 *puStack_40;
  QWidget *pQStack_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 < 0x62) {
    if (uVar1 == 0x27) {
      pQVar2 = this->data;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        auVar6._4_4_ = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
        auVar6._0_4_ = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
        auVar6._8_8_ = 0;
        QWidgetPrivate::update<QRect>(*(QWidgetPrivate **)&this->field_0x8,(QRect)(auVar6 << 0x40));
        return;
      }
      goto LAB_0030b5be;
    }
    if (uVar1 == 0x61) goto LAB_0030b458;
  }
  else if (uVar1 == 0xd2) {
    cVar7 = QGuiApplication::desktopSettingsAware();
    if (((cVar7 != '\0') &&
        ((char)(this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i != '\x11')) && (QCoreApplication::self != 0)) {
      cVar7 = QCoreApplication::closingDown();
      if (cVar7 == '\0') {
        if ((*(byte *)(*(long *)&this->field_0x8 + 0x244) & 4) != 0) {
          pQVar8 = QApplication::style();
          (**(code **)(*(long *)pQVar8 + 0x68))(pQVar8,this);
          if ((*(byte *)(*(long *)&this->field_0x8 + 0x244) & 4) != 0) {
            pQVar8 = QApplication::style();
            (**(code **)(*(long *)pQVar8 + 0x60))(pQVar8,this);
          }
        }
        local_48 = (code *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_48,StyleChange);
        QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_48);
        if ((this->data->widget_attributes & 0x8000) != 0) {
          update(this);
        }
        QEvent::~QEvent((QEvent *)&local_48);
      }
    }
  }
  else if (uVar1 == 100) {
LAB_0030b458:
    this_00 = *(QWidgetPrivate **)&this->field_0x8;
    pQVar2 = this->data;
    auVar5._4_4_ = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
    auVar5._0_4_ = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
    auVar5._8_8_ = 0;
    QWidgetPrivate::update<QRect>(this_00,(QRect)(auVar5 << 0x40));
    QWidgetPrivate::updateGeometry_helper(*(QWidgetPrivate **)&this->field_0x8,false);
    pQVar3 = this_00->layout;
    if (pQVar3 != (QLayout *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        (**(code **)(*(long *)pQVar3 + 0x70))();
        return;
      }
      goto LAB_0030b5be;
    }
  }
  else if (uVar1 == 0x62) {
    pQVar2 = this->data;
    auVar4._4_4_ = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
    auVar4._0_4_ = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
    auVar4._8_8_ = 0;
    QWidgetPrivate::update<QRect>(*(QWidgetPrivate **)&this->field_0x8,(QRect)(auVar4 << 0x40));
    local_30 = 0xaaaaaaaaffffffff;
    local_48 = QCss::ValueExtractor::extractGeometry;
    local_28 = 1;
    puStack_40 = (undefined1 *)0xaaaaaaaa0000800a;
    pQStack_38 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0030b5be:
  __stack_chk_fail();
}

Assistant:

void QWidget::changeEvent(QEvent * event)
{
    switch(event->type()) {
    case QEvent::EnabledChange: {
        update();
#if QT_CONFIG(accessibility)
        QAccessible::State s;
        s.disabled = true;
        QAccessibleStateChangeEvent event(this, s);
        QAccessible::updateAccessibility(&event);
#endif
        break;
    }

    case QEvent::FontChange:
    case QEvent::StyleChange: {
        Q_D(QWidget);
        update();
        updateGeometry();
        if (d->layout)
            d->layout->invalidate();
        break;
    }

    case QEvent::PaletteChange:
        update();
        break;

    case QEvent::ThemeChange:
        if (QGuiApplication::desktopSettingsAware() && windowType() != Qt::Desktop
            && qApp && !QCoreApplication::closingDown()) {
            if (testAttribute(Qt::WA_WState_Polished))
                QApplication::style()->unpolish(this);
            if (testAttribute(Qt::WA_WState_Polished))
                QApplication::style()->polish(this);
            QEvent styleChangedEvent(QEvent::StyleChange);
            QCoreApplication::sendEvent(this, &styleChangedEvent);
            if (isVisible())
                update();
        }
        break;

#ifdef Q_OS_MAC
    case QEvent::MacSizeChange:
        updateGeometry();
        break;
#endif

    default:
        break;
    }
}